

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<short>::test_all_algorithms
          (DivideTest<short> *this,short denom,set_t<short> *tested_denom)

{
  iterator iVar1;
  short local_1a;
  
  local_1a = denom;
  iVar1 = std::
          _Rb_tree<short,_short,_std::_Identity<short>,_std::less<short>,_std::allocator<short>_>::
          find(&tested_denom->_M_t,&local_1a);
  if (&(tested_denom->_M_t)._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar1._M_node) {
    test_many<(libdivide::Branching)0>(this,local_1a);
    test_many<(libdivide::Branching)1>(this,local_1a);
    std::_Rb_tree<short,short,std::_Identity<short>,std::less<short>,std::allocator<short>>::
    _M_insert_unique<short_const&>
              ((_Rb_tree<short,short,std::_Identity<short>,std::less<short>,std::allocator<short>> *
               )tested_denom,&local_1a);
  }
  return;
}

Assistant:

void test_all_algorithms(T denom, set_t<T> &tested_denom) {
#if !defined(__AVR__)
        if (tested_denom.end() == tested_denom.find(denom)) {
#endif
            PRINT_PROGRESS_MSG(F("Testing deom "));
            PRINT_PROGRESS_MSG(denom);
            PRINT_PROGRESS_MSG(F("\n"));
            test_many<BRANCHFULL>(denom);
            test_many<BRANCHFREE>(denom);
#if !defined(__AVR__)
            tested_denom.insert(denom);
        }
#else
        UNUSED(tested_denom);
#endif
    }